

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

xmlNsPtr xmlCopyNamespaceList(xmlNsPtr cur)

{
  xmlNsPtr pxVar1;
  xmlNsPtr pxVar2;
  xmlNsPtr q;
  xmlNsPtr p;
  xmlNsPtr ret;
  xmlNsPtr cur_local;
  
  p = (xmlNsPtr)0x0;
  q = (xmlNsPtr)0x0;
  for (ret = cur; ret != (xmlNsPtr)0x0; ret = ret->next) {
    pxVar2 = xmlCopyNamespace(ret);
    pxVar1 = pxVar2;
    if (q != (xmlNsPtr)0x0) {
      q->next = pxVar2;
      pxVar1 = p;
    }
    p = pxVar1;
    q = pxVar2;
  }
  return p;
}

Assistant:

xmlNsPtr
xmlCopyNamespaceList(xmlNsPtr cur) {
    xmlNsPtr ret = NULL;
    xmlNsPtr p = NULL,q;

    while (cur != NULL) {
        q = xmlCopyNamespace(cur);
	if (p == NULL) {
	    ret = p = q;
	} else {
	    p->next = q;
	    p = q;
	}
	cur = cur->next;
    }
    return(ret);
}